

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

int sznet::net::sockets::sz_close_eventfd(sz_event *event)

{
  int iVar1;
  sz_event *event_local;
  
  iVar1 = close(*event);
  return iVar1;
}

Assistant:

int sz_close_eventfd(sz_event& event)
{
#ifdef SZ_OS_LINUX
	return ::close(event);
#else
	closesocket(event.event_read);
	return closesocket(event.event_write);
#endif
}